

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O0

QByteArray * __thiscall
QMakeEvaluator::getCommandOutput(QMakeEvaluator *this,QString *args,int *exitCode)

{
  int iVar1;
  undefined4 uVar2;
  char *__s;
  QString *in_RCX;
  QProcess *in_RDX;
  QMakeEvaluator *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QByteArray *out;
  QByteArray errout;
  QProcess proc;
  QByteArray *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  QByteArray::QByteArray((QByteArray *)0x2c7941);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QProcess::QProcess((QProcess *)&local_18,(QObject *)0x0);
  runProcess(in_RSI,in_RDX,in_RCX);
  iVar1 = QProcess::exitStatus();
  if (iVar1 == 0) {
    uVar2 = QProcess::exitCode();
  }
  else {
    uVar2 = 0xffffffff;
  }
  *(undefined4 *)&(in_RCX->d).d = uVar2;
  QProcess::readAllStandardError();
  __s = QByteArray::constData((QByteArray *)0x2c7a02);
  fputs(__s,_stderr);
  QProcess::readAllStandardOutput();
  QByteArray::operator=
            ((QByteArray *)CONCAT44(uVar2,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68);
  QByteArray::~QByteArray((QByteArray *)0x2c7a3f);
  QByteArray::~QByteArray((QByteArray *)0x2c7a4e);
  QProcess::~QProcess((QProcess *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QByteArray QMakeEvaluator::getCommandOutput(const QString &args, int *exitCode) const
{
    QByteArray out;
#if QT_CONFIG(process)
    QProcess proc;
    runProcess(&proc, args);
    *exitCode = (proc.exitStatus() == QProcess::NormalExit) ? proc.exitCode() : -1;
    QByteArray errout = proc.readAllStandardError();
# ifdef PROEVALUATOR_FULL
    // FIXME: Qt really should have the option to set forwarding per channel
    fputs(errout.constData(), stderr);
# else
    if (!errout.isEmpty()) {
        if (errout.endsWith('\n'))
            errout.chop(1);
        m_handler->message(
            QMakeHandler::EvalError | (m_cumulative ? QMakeHandler::CumulativeEvalMessage : 0),
            QString::fromLocal8Bit(errout));
    }
# endif
    out = proc.readAllStandardOutput();
# ifdef Q_OS_WIN
    // FIXME: Qt's line end conversion on sequential files should really be fixed
    out.replace("\r\n", "\n");
# endif
#else
    if (FILE *proc = QT_POPEN(QString(QLatin1String("cd ")
                               + IoUtils::shellQuote(QDir::toNativeSeparators(currentDirectory()))
                               + QLatin1String(" && ") + args).toLocal8Bit().constData(), QT_POPEN_READ)) {
        while (!feof(proc)) {
            char buff[10 * 1024];
            int read_in = int(fread(buff, 1, sizeof(buff), proc));
            if (!read_in)
                break;
            out += QByteArray(buff, read_in);
        }
        int ec = QT_PCLOSE(proc);
# ifdef Q_OS_WIN
        *exitCode = ec >= 0 ? ec : -1;
# else
        *exitCode = WIFEXITED(ec) ? WEXITSTATUS(ec) : -1;
# endif
    }
# ifdef Q_OS_WIN
    out.replace("\r\n", "\n");
# endif
#endif
    return out;
}